

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

int fp_enc_row_mt_worker_hook(void *arg1,void *unused)

{
  int *piVar1;
  BLOCK_SIZE fp_block_size;
  uint uVar2;
  uint uVar3;
  pthread_mutex_t *__mutex;
  TileDataEnc *pTVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  AV1_COMP *pAVar10;
  TileInfo *tile;
  int current_mi_row;
  int end_of_frame;
  int cur_tile_id;
  AV1_COMP *local_88;
  uint local_7c;
  uint local_78;
  uint local_74;
  void *local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  AV1_COMMON *local_38;
  
  pAVar10 = *arg1;
  iVar8 = *(int *)((long)arg1 + 0x1cc);
  __mutex = (pAVar10->mt_info).enc_row_mt.mutex_;
  *(long *)(*(long *)((long)arg1 + 8) + 0x2b90) = (long)arg1 + 0x18;
  iVar6 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  local_88 = pAVar10;
  if (iVar6 == 0) {
    *(undefined4 *)((long)arg1 + 0xe8) = 1;
    local_38 = &pAVar10->common;
    iVar8 = (pAVar10->mt_info).enc_row_mt.thread_id_to_tile_id[iVar8];
    fp_block_size = pAVar10->fp_block_size;
    local_74 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [fp_block_size];
    end_of_frame = 0;
    cur_tile_id = iVar8;
    local_70 = arg1;
    while( true ) {
      pAVar10 = local_88;
      current_mi_row = -1;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if ((pAVar10->mt_info).enc_row_mt.firstpass_mt_exit != false) break;
      iVar8 = get_next_job(pAVar10->tile_data + iVar8,&current_mi_row,local_74);
      if (iVar8 == 0) {
        switch_tile_and_get_next_job
                  (local_38,pAVar10->tile_data,&cur_tile_id,&current_mi_row,&end_of_frame,1,
                   fp_block_size);
        iVar8 = end_of_frame;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        if (iVar8 != 0) goto LAB_001ae600;
      }
      else {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      iVar8 = cur_tile_id;
      pTVar4 = pAVar10->tile_data;
      lVar7 = (long)cur_tile_id;
      av1_first_pass_row(local_88,*(ThreadData_conflict **)((long)local_70 + 8),pTVar4 + lVar7,
                         current_mi_row >> (""[fp_block_size] & 0x1f),fp_block_size);
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      piVar1 = &pTVar4[lVar7].row_mt_sync.num_threads_working;
      *piVar1 = *piVar1 + -1;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
LAB_001ae600:
    *(undefined4 *)((long)local_70 + 0xe8) = 0;
    iVar8 = 1;
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    (pAVar10->mt_info).enc_row_mt.firstpass_mt_exit = true;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    uVar2 = (pAVar10->common).tiles.cols;
    local_40 = (long)(int)uVar2;
    uVar3 = (pAVar10->common).tiles.rows;
    local_78 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [pAVar10->fp_block_size];
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = uVar2;
    }
    local_50 = (ulong)uVar5;
    local_48 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      local_48 = 0;
    }
    local_7c = (uint)pAVar10->fp_block_size;
    for (local_58 = 0; local_58 != local_48; local_58 = local_58 + 1) {
      local_60 = local_58 * local_40 * 0x5d10;
      for (local_68 = 0; local_68 != local_50; local_68 = local_68 + 1) {
        piVar1 = (int *)((long)(pAVar10->tile_data[local_68].tctx.txb_skip_cdf + -1) + 0x2e +
                        local_60);
        tile = (TileInfo *)
               ((long)(pAVar10->tile_data[local_68].tctx.txb_skip_cdf + -1) + 0x2e + local_60);
        iVar6 = av1_get_unit_cols_in_tile(tile,(BLOCK_SIZE)local_7c);
        iVar9 = 0;
        for (iVar8 = *piVar1; iVar8 < tile->mi_row_end; iVar8 = iVar8 + local_78) {
          (*(local_88->mt_info).enc_row_mt.sync_write_ptr)
                    ((AV1EncRowMultiThreadSync *)(piVar1 + 0x1736),iVar9,iVar6 + -1,iVar6);
          iVar9 = iVar9 + 1;
        }
        pAVar10 = local_88;
      }
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int fp_enc_row_mt_worker_hook(void *arg1, void *unused) {
  EncWorkerData *const thread_data = (EncWorkerData *)arg1;
  AV1_COMP *const cpi = thread_data->cpi;
  int thread_id = thread_data->thread_id;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *enc_row_mt_mutex_ = enc_row_mt->mutex_;
#endif
  (void)unused;
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  xd->error_info = error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
    enc_row_mt->firstpass_mt_exit = true;
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    set_firstpass_encode_done(cpi);
    return 0;
  }
  error_info->setjmp = 1;

  AV1_COMMON *const cm = &cpi->common;
  int cur_tile_id = enc_row_mt->thread_id_to_tile_id[thread_id];
  assert(cur_tile_id != -1);

  const BLOCK_SIZE fp_block_size = cpi->fp_block_size;
  const int unit_height = mi_size_high[fp_block_size];
  int end_of_frame = 0;
  while (1) {
    int current_mi_row = -1;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    bool firstpass_mt_exit = enc_row_mt->firstpass_mt_exit;
    if (!firstpass_mt_exit && !get_next_job(&cpi->tile_data[cur_tile_id],
                                            &current_mi_row, unit_height)) {
      // No jobs are available for the current tile. Query for the status of
      // other tiles and get the next job if available
      switch_tile_and_get_next_job(cm, cpi->tile_data, &cur_tile_id,
                                   &current_mi_row, &end_of_frame, 1,
                                   fp_block_size);
    }
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    // When firstpass_mt_exit is set to true, other workers need not pursue any
    // further jobs.
    if (firstpass_mt_exit || end_of_frame) break;

    TileDataEnc *const this_tile = &cpi->tile_data[cur_tile_id];
    AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;
    ThreadData *td = thread_data->td;

    assert(current_mi_row != -1 &&
           current_mi_row < this_tile->tile_info.mi_row_end);

    const int unit_height_log2 = mi_size_high_log2[fp_block_size];
    av1_first_pass_row(cpi, td, this_tile, current_mi_row >> unit_height_log2,
                       fp_block_size);
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    row_mt_sync->num_threads_working--;
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
  }
  error_info->setjmp = 0;
  return 1;
}